

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O1

void __thiscall QSynth::resetMIDIChannelsAssignment(QSynth *this,bool engageChannel1)

{
  QMutex *pQVar1;
  undefined1 *sysex;
  bool bVar2;
  
  if (this->realtimeHelper != (RealtimeHelper *)0x0) {
    RealtimeHelper::resetMidiChannelsAssignment(this->realtimeHelper,engageChannel1);
    return;
  }
  pQVar1 = this->synthMutex;
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::lockInternal();
    }
  }
  if (this->state == SynthState_OPEN) {
    sysex = writeMIDIChannelsAssignmentResetSysex(MT32Emu::Synth*,bool)::
            sysexStandardChannelAssignment;
    if (engageChannel1) {
      sysex = writeMIDIChannelsAssignmentResetSysex(MT32Emu::Synth*,bool)::
              sysexChannel1EngagedAssignment;
    }
    MT32Emu::Synth::writeSysex(this->synth,'\x10',sysex,0xc);
  }
  if (pQVar1 != (QMutex *)0x0) {
    LOCK();
    bVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x1;
    if (bVar2) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    }
    UNLOCK();
    if (!bVar2) {
      QBasicMutex::unlockInternal();
      return;
    }
  }
  return;
}

Assistant:

void QSynth::resetMIDIChannelsAssignment(bool engageChannel1) {
	if (isRealtime()) {
		realtimeHelper->resetMidiChannelsAssignment(engageChannel1);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) writeMIDIChannelsAssignmentResetSysex(synth, engageChannel1);
	}
}